

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  Message *pMVar1;
  Message local_38;
  char *local_30;
  char *value_str;
  Int32 *value_local;
  char *flag_local;
  char *str_local;
  
  value_str = (char *)value;
  value_local = (Int32 *)flag;
  flag_local = str;
  local_30 = ParseFlagValue(str,flag,false);
  if (local_30 == (char *)0x0) {
    str_local._7_1_ = 0;
  }
  else {
    Message::Message(&local_38);
    pMVar1 = Message::operator<<(&local_38,(char (*) [21])"The value of flag --");
    pMVar1 = Message::operator<<(pMVar1,(char **)&value_local);
    str_local._7_1_ = ParseInt32(pMVar1,local_30,(Int32 *)value_str);
    Message::~Message((Message *)0x15d451);
  }
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}